

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vec<2,_float,_(glm::qualifier)0> __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::
getData_helper<glm::vec<2,float,(glm::qualifier)0>>(GLAttributeBuffer *this,size_t ind)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  ulong in_RCX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  int __fd;
  ulong in_RSI;
  AttributeBuffer *in_RDI;
  vec<2,_float,_(glm::qualifier)0> vVar4;
  vec<2,_float,_(glm::qualifier)0> readValue;
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  AttributeBuffer *message;
  
  local_18 = in_RSI;
  message = in_RDI;
  bVar1 = AttributeBuffer::isSet(in_RDI);
  __fd = (int)in_RSI;
  if (bVar1) {
    iVar3 = AttributeBuffer::getDataSize(in_RDI);
    iVar2 = AttributeBuffer::getArrayCount(in_RDI);
    __addr = (sockaddr *)(long)iVar2;
    in_RCX = iVar3 * (long)__addr;
    if (local_18 < in_RCX) goto LAB_00523adb;
  }
  std::allocator<char>::allocator();
  __fd = 0x81241b;
  std::__cxx11::string::string(local_38,"bad getData",&local_39);
  exception((string *)message);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  __addr = extraout_RDX;
LAB_00523adb:
  bind((GLAttributeBuffer *)in_RDI,__fd,__addr,(socklen_t)in_RCX);
  vVar4.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  vVar4.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  return vVar4;
}

Assistant:

T GLAttributeBuffer::getData_helper(size_t ind) {
  if (!isSet() || ind >= static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  T readValue{};
  return readValue;
}